

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O0

size_t xmi_process_TIMB(PBuffer *buffer,MidiFile *param_2)

{
  unsigned_short uVar1;
  element_type *peVar2;
  long lVar3;
  size_t sVar4;
  Stream *pSVar5;
  uint local_a4;
  uint local_a0;
  allocator<char> local_99;
  string local_98 [32];
  undefined1 local_78 [22];
  uint8_t bank;
  uint8_t patch;
  size_t i;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [16];
  size_t count;
  MidiFile *param_1_local;
  PBuffer *buffer_local;
  
  count = (size_t)param_2;
  param_1_local = (MidiFile *)buffer;
  peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  Buffer::set_endianess(peVar2,EndianessLittle);
  peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  uVar1 = Buffer::pop<unsigned_short>(peVar2);
  local_28._8_8_ = ZEXT28(uVar1);
  lVar3 = local_28._8_8_ * 2;
  peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  sVar4 = Buffer::get_size(peVar2);
  if (lVar3 + 2U == sVar4) {
    for (stack0xffffffffffffff98 = 0; stack0xffffffffffffff98 < (ulong)local_28._8_8_;
        register0x00000000 = stack0xffffffffffffff98 + 1) {
      peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          buffer);
      local_78[0xf] = Buffer::pop<unsigned_char>(peVar2);
      peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          buffer);
      local_78[0xe] = Buffer::pop<unsigned_char>(peVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_98,"xmi2mid",&local_99);
      Log::Logger::operator[]((Logger *)local_78,(string *)&Log::Verbose);
      pSVar5 = Log::Stream::operator<<((Stream *)local_78,"\tTIMB entry ");
      pSVar5 = Log::Stream::operator<<(pSVar5,(unsigned_long *)(local_78 + 0x10));
      pSVar5 = Log::Stream::operator<<(pSVar5,": ");
      local_a0 = (uint)local_78[0xf];
      pSVar5 = Log::Stream::operator<<(pSVar5,(int *)&local_a0);
      pSVar5 = Log::Stream::operator<<(pSVar5,", ");
      local_a4 = (uint)local_78[0xe];
      Log::Stream::operator<<(pSVar5,(int *)&local_a4);
      Log::Stream::~Stream((Stream *)local_78);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,"xmi2mid",&local_49);
    Log::Logger::operator[]((Logger *)local_28,(string *)&Log::Debug);
    Log::Stream::operator<<((Stream *)local_28,"\tInconsistent TIMB block.");
    Log::Stream::~Stream((Stream *)local_28);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  sVar4 = Buffer::get_size(peVar2);
  return sVar4;
}

Assistant:

static size_t
xmi_process_TIMB(PBuffer buffer, MidiFile * /*midi*/) {
  buffer->set_endianess(Buffer::EndianessLittle);
  size_t count = buffer->pop<uint16_t>();
  if (count*2 + 2 != buffer->get_size()) {
    Log::Debug["xmi2mid"] << "\tInconsistent TIMB block.";
  } else {
    for (size_t i = 0; i < count; i++) {
      uint8_t patch = buffer->pop<uint8_t>();
      uint8_t bank = buffer->pop<uint8_t>();
      Log::Verbose["xmi2mid"] << "\tTIMB entry " << i << ": "
                              << static_cast<int>(patch) << ", "
                              << static_cast<int>(bank);
    }
  }
  return buffer->get_size();
}